

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O0

char * only_file_name_and_ext(char *path)

{
  char *pcVar1;
  char *in_RDI;
  char *s2;
  char *s1;
  char *local_20;
  char *local_10;
  
  local_10 = strrchr(in_RDI,0x2f);
  pcVar1 = strrchr(in_RDI,0x5c);
  if (local_10 < pcVar1) {
    local_10 = pcVar1;
  }
  local_20 = in_RDI;
  if (local_10 != (char *)0x0) {
    local_20 = local_10 + 1;
  }
  return local_20;
}

Assistant:

static const char * only_file_name_and_ext(const char * path)
{
  const char * s1 = strrchr(path, '/');
  const char * s2 = strrchr(path, '\\');
  if (s2 > s1)
    s1 = s2;

  return s1 ? s1 + 1 : path;
}